

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

Page * __thiscall
DListBase<Memory::CustomHeap::Page,RealCount>::
PrependNode<Memory::ArenaAllocator,char*,void*,Memory::CustomHeap::BucketId>
          (DListBase<Memory::CustomHeap::Page,RealCount> *this,ArenaAllocator *allocator,
          char *param1,void *param2,BucketId param3)

{
  long lVar1;
  long *plVar2;
  
  plVar2 = (long *)new<Memory::ArenaAllocator>(0x38,allocator,0x35916e);
  *(undefined2 *)(plVar2 + 2) = 0;
  plVar2[3] = (long)param2;
  plVar2[4] = 0xffffffff;
  plVar2[5] = (long)param1;
  *(BucketId *)(plVar2 + 6) = param3;
  lVar1 = *(long *)this;
  plVar2[1] = *(long *)(lVar1 + 8);
  *plVar2 = lVar1;
  **(undefined8 **)(lVar1 + 8) = plVar2;
  *(long **)(lVar1 + 8) = plVar2;
  *(int *)(this + 0x10) = *(int *)(this + 0x10) + 1;
  return (Page *)(plVar2 + 2);
}

Assistant:

TData * PrependNode(TAllocator * allocator, TParam1 param1, TParam2 param2, TParam3 param3)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, param1, param2, param3);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }